

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledBox.cpp
# Opt level: O1

DecoratorDataHandle __thiscall
Rml::DecoratorTiledBox::GenerateElementData
          (DecoratorTiledBox *this,Element *element,BoxArea paint_area)

{
  undefined1 *puVar1;
  undefined1 *this_00;
  Geometry *pGVar2;
  void *pvVar3;
  bool bVar4;
  code *pcVar5;
  Vector2f surface_origin;
  Vector2f VVar6;
  Vector2f VVar7;
  Vector2f VVar8;
  Vector2f VVar9;
  Vector2f VVar10;
  Vector2f VVar11;
  Vector2f VVar12;
  Vector2f surface_dimensions;
  Vector2f surface_dimensions_00;
  Vector2f surface_dimensions_01;
  Vector2f surface_dimensions_02;
  Vector2f surface_dimensions_03;
  Vector2f tile_dimensions;
  Vector2f surface_dimensions_04;
  Vector2f surface_dimensions_05;
  Vector2f tile_dimensions_00;
  Vector2f tile_dimensions_01;
  float fVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  bool bVar16;
  uint num_textures;
  ComputedValues *computed;
  DecoratorTiledBoxData *this_01;
  RenderManager *mesh_00;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float minimum_height;
  float fVar23;
  Texture texture;
  Mesh mesh [9];
  RenderBox render_box;
  Vector2f local_318;
  float local_308;
  float fStack_304;
  float local_2f8;
  float fStack_2f4;
  Vector2f local_2d8;
  float local_2c8;
  float local_2b8;
  float fStack_2b4;
  float local_2a8;
  float fStack_2a4;
  Vector2f local_298;
  Vector2f local_288;
  float local_278;
  float fStack_274;
  float local_268;
  float fStack_264;
  undefined1 local_258 [40];
  Tile *local_230 [3];
  Mesh local_218 [9];
  RenderBox local_60;
  
  lVar17 = 0x30;
  while ((-1 < *(int *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar17
                       ) ||
         (bVar16 = Assert("RMLUI_ASSERT(tiles[i].texture_index >= 0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorTiledBox.cpp"
                          ,0x68), bVar16))) {
    texture = Decorator::GetTexture
                        ((Decorator *)this,
                         *(int *)((long)&(this->super_DecoratorTiled).super_Decorator.
                                         _vptr_Decorator + lVar17));
    DecoratorTiled::Tile::CalculateDimensions
              ((Tile *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar17
                       ),texture);
    lVar17 = lVar17 + 0x4c;
    if (lVar17 == 0x2dc) {
      Element::GetRenderBox(&local_60,element,paint_area,0);
      puVar1 = &this->field_0x30;
      VVar6 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)puVar1,element);
      this_00 = &this->field_0x1f8;
      VVar7 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_00,element);
      local_230[2] = (Tile *)&this->field_0x7c;
      VVar8 = DecoratorTiled::Tile::GetNaturalDimensions(local_230[2],element);
      local_258._32_8_ = &this->field_0xc8;
      VVar9 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)local_258._32_8_,element);
      local_258._24_8_ = &this->field_0x244;
      VVar10 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)local_258._24_8_,element);
      local_258._16_8_ = &this->field_0x114;
      VVar11 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)local_258._16_8_,element);
      local_230[1] = (Tile *)&this->field_0x160;
      VVar12 = DecoratorTiled::Tile::GetNaturalDimensions(local_230[1],element);
      local_230[0] = (Tile *)&this->field_0x1ac;
      local_2d8 = DecoratorTiled::Tile::GetNaturalDimensions(local_230[0],element);
      fVar18 = local_2d8.x;
      local_2a8 = VVar8.x;
      fStack_2a4 = VVar8.y;
      local_268 = VVar6.x;
      fStack_264 = VVar6.y;
      local_2b8 = local_60.fill_size.x;
      fStack_2b4 = local_60.fill_size.y;
      fVar20 = local_268 + local_2a8;
      local_298.x = VVar12.x;
      local_298.y = VVar12.y;
      fVar13 = local_298.y;
      local_278 = VVar9.x;
      fStack_274 = VVar9.y;
      local_2f8 = VVar11.x;
      fStack_2f4 = VVar11.y;
      local_318.x = VVar7.x;
      fVar22 = local_318.x;
      local_318.y = VVar7.y;
      fVar19 = local_318.y;
      local_308 = VVar10.x;
      fStack_304 = VVar10.y;
      if (fVar20 <= local_2b8) {
        local_2c8 = local_298.x;
      }
      else {
        bVar16 = NAN(local_268);
        bVar4 = local_268 == local_298.x;
        local_268 = (local_268 / fVar20) * local_2b8;
        local_2c8 = local_298.x;
        if ((bVar4) && (!bVar16 && !NAN(local_298.x))) {
          local_2c8 = local_268;
        }
        bVar16 = NAN(local_2a8);
        bVar4 = local_2a8 == fVar18;
        local_2a8 = (local_2a8 / fVar20) * local_2b8;
        if ((bVar4) && (!bVar16 && !NAN(fVar18))) {
          local_2d8.y = local_2d8.y;
          local_2d8.x = local_2a8;
        }
      }
      fVar20 = local_278 + local_2f8;
      if (local_2b8 < fVar20) {
        bVar16 = NAN(local_278);
        bVar4 = local_278 == local_298.x;
        local_278 = (local_278 / fVar20) * local_2b8;
        if ((bVar4) && (!bVar16 && !NAN(local_298.x))) {
          local_2c8 = local_278;
        }
        bVar16 = NAN(local_2f8);
        bVar4 = local_2f8 == fVar18;
        local_2f8 = (local_2f8 / fVar20) * local_2b8;
        if ((bVar4) && (!bVar16 && !NAN(fVar18))) {
          local_2d8.x = local_2f8;
        }
      }
      fVar23 = fStack_264 + fStack_274;
      fVar18 = fStack_304;
      fVar20 = local_318.y;
      if (fStack_2b4 < fVar23) {
        fVar20 = (fStack_264 / fVar23) * fStack_2b4;
        bVar16 = fStack_264 == local_318.y;
        fVar18 = (fStack_274 / fVar23) * fStack_2b4;
        bVar4 = fStack_274 == fStack_304;
        fStack_274 = fVar18;
        fStack_264 = fVar20;
        fVar18 = (float)(~-(uint)bVar4 & (uint)fStack_304 | (uint)fVar18 & -(uint)bVar4);
        fVar20 = (float)(~-(uint)bVar16 & (uint)local_318.y | (uint)fVar20 & -(uint)bVar16);
      }
      local_318.y = fStack_264;
      local_318.x = local_268;
      local_298.y = fStack_274;
      local_298.x = local_278;
      local_288.y = local_60.border_widths._M_elems[0];
      local_288.x = local_60.border_widths._M_elems[3];
      fVar23 = fStack_2a4 + fStack_2f4;
      if (fStack_2b4 < fVar23) {
        fVar21 = (fStack_2a4 / fVar23) * fStack_2b4;
        fVar20 = (float)(~-(uint)(fStack_2a4 == fVar19) & (uint)fVar20 |
                        (uint)fVar21 & -(uint)(fStack_2a4 == fVar19));
        fVar19 = (fStack_2f4 / fVar23) * fStack_2b4;
        fVar18 = (float)(~-(uint)(fStack_2f4 == fStack_304) & (uint)fVar18 |
                        (uint)fVar19 & -(uint)(fStack_2f4 == fStack_304));
        fStack_2f4 = fVar19;
        fStack_2a4 = fVar21;
      }
      surface_dimensions_04.y = fStack_2a4;
      surface_dimensions_04.x = local_2a8;
      tile_dimensions_01.y = fVar20;
      tile_dimensions_01.x = fVar22;
      tile_dimensions_00.y = fVar18;
      tile_dimensions_00.x = local_308;
      surface_dimensions_05.y = fStack_2f4;
      surface_dimensions_05.x = local_2f8;
      computed = Element::GetComputedValues(element);
      memset(local_218,0,0x1b0);
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)puVar1,local_218 + *(int *)puVar1,computed,local_288,local_318,local_318);
      VVar6.y = local_60.border_widths._M_elems[0] + 0.0;
      VVar6.x = local_60.border_widths._M_elems[3] + local_268;
      surface_dimensions.y = fVar20;
      surface_dimensions.x = local_2b8 - (local_268 + local_2a8);
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)this_00,local_218 + *(int *)this_00,computed,VVar6,surface_dimensions,
                 tile_dimensions_01);
      VVar7.y = local_60.border_widths._M_elems[0] + 0.0;
      VVar7.x = (local_2b8 - local_2a8) + local_60.border_widths._M_elems[3];
      DecoratorTiled::Tile::GenerateGeometry
                (local_230[2],local_218 + local_230[2]->texture_index,computed,VVar7,
                 surface_dimensions_04,surface_dimensions_04);
      tile_dimensions.y = fVar13;
      tile_dimensions.x = local_2c8;
      surface_origin.y = local_60.border_widths._M_elems[0] + fStack_264;
      surface_origin.x = local_60.border_widths._M_elems[3] + 0.0;
      surface_dimensions_03.y = fStack_2b4 - (fStack_264 + fStack_274);
      surface_dimensions_03.x = local_2c8;
      DecoratorTiled::Tile::GenerateGeometry
                (local_230[1],local_218 + local_230[1]->texture_index,computed,surface_origin,
                 surface_dimensions_03,tile_dimensions);
      fVar22 = local_2d8.x;
      VVar8.y = local_60.border_widths._M_elems[0] + fStack_2a4;
      VVar8.x = (local_2b8 - fVar22) + local_60.border_widths._M_elems[3];
      surface_dimensions_00.y = fStack_2b4 - (fStack_2a4 + fStack_2f4);
      surface_dimensions_00.x = fVar22;
      DecoratorTiled::Tile::GenerateGeometry
                (local_230[0],local_218 + local_230[0]->texture_index,computed,VVar8,
                 surface_dimensions_00,local_2d8);
      VVar9.y = (fStack_2b4 - fStack_274) + local_60.border_widths._M_elems[0];
      VVar9.x = local_60.border_widths._M_elems[3] + 0.0;
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)local_258._32_8_,local_218 + *(int *)local_258._32_8_,computed,VVar9,
                 local_298,local_298);
      VVar10.y = (fStack_2b4 - fVar18) + local_60.border_widths._M_elems[0];
      VVar10.x = local_60.border_widths._M_elems[3] + local_278;
      surface_dimensions_01.y = fVar18;
      surface_dimensions_01.x = local_2b8 - (local_278 + local_2f8);
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)local_258._24_8_,local_218 + *(int *)local_258._24_8_,computed,VVar10,
                 surface_dimensions_01,tile_dimensions_00);
      VVar11.y = (fStack_2b4 - fStack_2f4) + local_60.border_widths._M_elems[0];
      VVar11.x = (local_2b8 - local_2f8) + local_60.border_widths._M_elems[3];
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)local_258._16_8_,local_218 + *(int *)local_258._16_8_,computed,VVar11,
                 surface_dimensions_05,surface_dimensions_05);
      puVar1 = &this->field_0x290;
      VVar6 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)puVar1,element);
      VVar12.y = local_60.border_widths._M_elems[0] + fVar20;
      VVar12.x = local_60.border_widths._M_elems[3] + local_2c8;
      surface_dimensions_02.y = fStack_2b4 - (fVar18 + fVar20);
      surface_dimensions_02.x = local_2b8 - (fVar22 + local_2c8);
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)puVar1,local_218 + *(int *)puVar1,computed,VVar12,surface_dimensions_02,
                 VVar6);
      num_textures = Decorator::GetNumTextures((Decorator *)this);
      this_01 = (DecoratorTiledBoxData *)operator_new(0x10);
      DecoratorTiledBoxData::DecoratorTiledBoxData(this_01,num_textures);
      mesh_00 = Element::GetRenderManager(element);
      if (0 < (int)num_textures) {
        lVar17 = 0;
        do {
          RenderManager::MakeGeometry((RenderManager *)local_258,(Mesh *)mesh_00);
          pGVar2 = this_01->geometry;
          UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
          ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                              *)((long)&(pGVar2->
                                        super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                                        ).render_manager + lVar17));
          uVar15 = local_258._8_4_;
          uVar14 = local_258._0_8_;
          local_258._0_8_ = (RenderInterface *)0x0;
          *(undefined8 *)
           ((long)&(pGVar2->
                   super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                   ).render_manager + lVar17) = uVar14;
          local_258._8_4_ = 0xffffffff;
          *(undefined4 *)
           ((long)&(pGVar2->
                   super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                   ).resource_handle + lVar17) = uVar15;
          UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
          ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                              *)local_258);
          lVar17 = lVar17 + 0x10;
        } while ((ulong)num_textures << 4 != lVar17);
      }
      lVar17 = 0x1b0;
      do {
        pvVar3 = *(void **)((long)local_230 + lVar17);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)local_218 + lVar17 + -8) - (long)pvVar3);
        }
        pvVar3 = *(void **)(local_258 + lVar17 + 0x10);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)(local_258 + lVar17 + 0x20) - (long)pvVar3);
        }
        lVar17 = lVar17 + -0x30;
      } while (lVar17 != 0);
      return (DecoratorDataHandle)this_01;
    }
  }
  pcVar5 = (code *)invalidInstructionException();
  (*pcVar5)();
}

Assistant:

DecoratorDataHandle DecoratorTiledBox::GenerateElementData(Element* element, BoxArea paint_area) const
{
	// Initialise the tiles for this element.
	for (int i = 0; i < 9; i++)
	{
		RMLUI_ASSERT(tiles[i].texture_index >= 0);
		tiles[i].CalculateDimensions(GetTexture(tiles[i].texture_index));
	}

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f offset = render_box.GetFillOffset();
	const Vector2f size = render_box.GetFillSize();

	// Calculate the natural dimensions of tile corners and edges.
	const Vector2f natural_top_left = tiles[TOP_LEFT_CORNER].GetNaturalDimensions(element);
	const Vector2f natural_top = tiles[TOP_EDGE].GetNaturalDimensions(element);
	const Vector2f natural_top_right = tiles[TOP_RIGHT_CORNER].GetNaturalDimensions(element);

	const Vector2f natural_bottom_left = tiles[BOTTOM_LEFT_CORNER].GetNaturalDimensions(element);
	const Vector2f natural_bottom = tiles[BOTTOM_EDGE].GetNaturalDimensions(element);
	const Vector2f natural_bottom_right = tiles[BOTTOM_RIGHT_CORNER].GetNaturalDimensions(element);

	const Vector2f natural_left = tiles[LEFT_EDGE].GetNaturalDimensions(element);
	const Vector2f natural_right = tiles[RIGHT_EDGE].GetNaturalDimensions(element);

	// Initialize the to-be-determined dimensions of the tiles.
	Vector2f top_left = natural_top_left;
	Vector2f top = natural_top;
	Vector2f top_right = natural_top_right;

	Vector2f bottom_left = natural_bottom_left;
	Vector2f bottom = natural_bottom;
	Vector2f bottom_right = natural_bottom_right;

	Vector2f left = natural_left;
	Vector2f right = natural_right;

	// Scale the top corners down if appropriate. If they are scaled, then the left and right edges are also scaled
	// if they shared a width with their corner. Best solution? Don't know.
	if (size.x < top_left.x + top_right.x)
	{
		float minimum_width = top_left.x + top_right.x;

		top_left.x = size.x * (top_left.x / minimum_width);
		if (natural_top_left.x == natural_left.x)
			left.x = top_left.x;

		top_right.x = size.x * (top_right.x / minimum_width);
		if (natural_top_right.x == natural_right.x)
			right.x = top_right.x;
	}

	// Scale the bottom corners down if appropriate. If they are scaled, then the left and right edges are also scaled
	// if they shared a width with their corner. Best solution? Don't know.
	if (size.x < bottom_left.x + bottom_right.x)
	{
		float minimum_width = bottom_left.x + bottom_right.x;

		bottom_left.x = size.x * (bottom_left.x / minimum_width);
		if (natural_bottom_left.x == natural_left.x)
			left.x = bottom_left.x;

		bottom_right.x = size.x * (bottom_right.x / minimum_width);
		if (natural_bottom_right.x == natural_right.x)
			right.x = bottom_right.x;
	}

	// Scale the left corners down if appropriate. If they are scaled, then the top and bottom edges are also scaled
	// if they shared a width with their corner. Best solution? Don't know.
	if (size.y < top_left.y + bottom_left.y)
	{
		float minimum_height = top_left.y + bottom_left.y;

		top_left.y = size.y * (top_left.y / minimum_height);
		if (natural_top_left.y == natural_top.y)
			top.y = top_left.y;

		bottom_left.y = size.y * (bottom_left.y / minimum_height);
		if (natural_bottom_left.y == natural_bottom.y)
			bottom.y = bottom_left.y;
	}

	// Scale the right corners down if appropriate. If they are scaled, then the top and bottom edges are also scaled
	// if they shared a width with their corner. Best solution? Don't know.
	if (size.y < top_right.y + bottom_right.y)
	{
		float minimum_height = top_right.y + bottom_right.y;

		top_right.y = size.y * (top_right.y / minimum_height);
		if (natural_top_right.y == natural_top.y)
			top.y = top_right.y;

		bottom_right.y = size.y * (bottom_right.y / minimum_height);
		if (natural_bottom_right.y == natural_bottom.y)
			bottom.y = bottom_right.y;
	}

	const ComputedValues& computed = element->GetComputedValues();
	Mesh mesh[COUNT];

	// Generate the geometry for the top-left tile.
	tiles[TOP_LEFT_CORNER].GenerateGeometry(mesh[tiles[TOP_LEFT_CORNER].texture_index], computed, offset, top_left, top_left);
	// Generate the geometry for the top edge tiles.
	tiles[TOP_EDGE].GenerateGeometry(mesh[tiles[TOP_EDGE].texture_index], computed, offset + Vector2f(top_left.x, 0),
		Vector2f(size.x - (top_left.x + top_right.x), top.y), top);
	// Generate the geometry for the top-right tile.
	tiles[TOP_RIGHT_CORNER].GenerateGeometry(mesh[tiles[TOP_RIGHT_CORNER].texture_index], computed, offset + Vector2f(size.x - top_right.x, 0),
		top_right, top_right);

	// Generate the geometry for the left side.
	tiles[LEFT_EDGE].GenerateGeometry(mesh[tiles[LEFT_EDGE].texture_index], computed, offset + Vector2f(0, top_left.y),
		Vector2f(left.x, size.y - (top_left.y + bottom_left.y)), left);

	// Generate the geometry for the right side.
	tiles[RIGHT_EDGE].GenerateGeometry(mesh[tiles[RIGHT_EDGE].texture_index], computed, offset + Vector2f((size.x - right.x), top_right.y),
		Vector2f(right.x, size.y - (top_right.y + bottom_right.y)), right);

	// Generate the geometry for the bottom-left tile.
	tiles[BOTTOM_LEFT_CORNER].GenerateGeometry(mesh[tiles[BOTTOM_LEFT_CORNER].texture_index], computed, offset + Vector2f(0, size.y - bottom_left.y),
		bottom_left, bottom_left);
	// Generate the geometry for the bottom edge tiles.
	tiles[BOTTOM_EDGE].GenerateGeometry(mesh[tiles[BOTTOM_EDGE].texture_index], computed, offset + Vector2f(bottom_left.x, size.y - bottom.y),
		Vector2f(size.x - (bottom_left.x + bottom_right.x), bottom.y), bottom);
	// Generate the geometry for the bottom-right tile.
	tiles[BOTTOM_RIGHT_CORNER].GenerateGeometry(mesh[tiles[BOTTOM_RIGHT_CORNER].texture_index], computed,
		offset + Vector2f(size.x - bottom_right.x, size.y - bottom_right.y), bottom_right, bottom_right);

	// Generate the centre geometry.
	Vector2f centre_dimensions = tiles[CENTRE].GetNaturalDimensions(element);
	Vector2f centre_surface_dimensions(size.x - (left.x + right.x), size.y - (top.y + bottom.y));

	tiles[CENTRE].GenerateGeometry(mesh[tiles[CENTRE].texture_index], computed, offset + Vector2f(left.x, top.y), centre_surface_dimensions,
		centre_dimensions);

	const int num_textures = GetNumTextures();
	DecoratorTiledBoxData* data = new DecoratorTiledBoxData(num_textures);
	RenderManager* render_manager = element->GetRenderManager();

	// Set the mesh and textures on the geometry.
	for (int i = 0; i < num_textures; i++)
		data->geometry[i] = render_manager->MakeGeometry(std::move(mesh[i]));

	return reinterpret_cast<DecoratorDataHandle>(data);
}